

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

undefined8
duckdb::Exception::ConstructMessageRecursive<std::__cxx11::string,long,unsigned_long>
          (string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          long params,unsigned_long params_1)

{
  string *in_RCX;
  undefined8 in_RDI;
  value_type *in_stack_ffffffffffffff38;
  string local_88 [32];
  undefined1 local_68 [8];
  unsigned_long in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  
  std::__cxx11::string::string(local_88,in_RCX);
  duckdb::ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>(local_68,local_88);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            in_RCX,in_stack_ffffffffffffff38);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x6c58a9);
  std::__cxx11::string::~string(local_88);
  ConstructMessageRecursive<long,unsigned_long>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}